

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase679::run(TestCase679 *this)

{
  __pid_t _Var1;
  TransformPromiseNodeBase *pTVar2;
  Disposer *pDVar3;
  AttachmentPromiseNodeBase *this_00;
  bool destroyed;
  Own<kj::_::PromiseNode> local_b0;
  Own<kj::_::PromiseNode> local_a0;
  Promise<int> promise;
  Own<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::DestructorDetector>_>_>
  local_80;
  WaitScope waitScope;
  Own<kj::_::PromiseNode> local_60;
  EventLoop loop;
  
  destroyed = false;
  EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  _::yield();
  pTVar2 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar2,&local_a0,
             _::
             TransformPromiseNode<int,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:685:36),_kj::_::PropagateException>
             ::anon_class_8_1_8c041cb9_for_func::operator());
  (pTVar2->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0041bf60;
  pTVar2[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)&destroyed;
  local_b0.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<int,kj::_::Void,kj::(anonymous_namespace)::TestCase679::run()::$_0,kj::_::PropagateException>>
        ::instance;
  local_80.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<int,kj::_::Void,kj::(anonymous_namespace)::TestCase679::run()::$_0,kj::_::PropagateException>>
        ::instance;
  local_b0.ptr = (PromiseNode *)0x0;
  local_60.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<int,kj::_::Void,kj::(anonymous_namespace)::TestCase679::run()::$_0,kj::_::PropagateException>>
        ::instance;
  local_80.ptr = (AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::DestructorDetector>_> *)
                 0x0;
  local_60.ptr = (PromiseNode *)pTVar2;
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_80);
  Own<kj::_::PromiseNode>::dispose(&local_b0);
  Own<kj::_::PromiseNode>::dispose(&local_a0);
  pDVar3 = (Disposer *)operator_new(8);
  pDVar3->_vptr_Disposer = (_func_int **)&destroyed;
  this_00 = (AttachmentPromiseNodeBase *)operator_new(0x28);
  _::AttachmentPromiseNodeBase::AttachmentPromiseNodeBase(this_00,&local_60);
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0041bfe8;
  this_00[1].super_PromiseNode._vptr_PromiseNode =
       (_func_int **)&_::HeapDisposer<kj::(anonymous_namespace)::DestructorDetector>::instance;
  this_00[1].dependency.disposer = pDVar3;
  local_80.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::DestructorDetector>>>
        ::instance;
  local_b0.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::DestructorDetector>>>
        ::instance;
  local_80.ptr = (AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::DestructorDetector>_> *)
                 0x0;
  promise.super_PromiseBase.node.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::DestructorDetector>>>
        ::instance;
  local_b0.ptr = (PromiseNode *)0x0;
  promise.super_PromiseBase.node.ptr = (PromiseNode *)this_00;
  Own<kj::_::PromiseNode>::dispose(&local_b0);
  Own<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::DestructorDetector>_>_>::~Own
            (&local_80);
  Own<kj::_::PromiseNode>::dispose(&local_60);
  pTVar2 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar2,(Own<kj::_::PromiseNode> *)&promise,
             _::
             TransformPromiseNode<int,_int,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:690:26),_kj::_::PropagateException>
             ::anon_class_8_1_8c041cb9_for_func::operator());
  (pTVar2->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0041c0a0;
  pTVar2[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)&destroyed;
  local_b0.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<int,int,kj::(anonymous_namespace)::TestCase679::run()::$_1,kj::_::PropagateException>>
        ::instance;
  local_80.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<int,int,kj::(anonymous_namespace)::TestCase679::run()::$_1,kj::_::PropagateException>>
        ::instance;
  local_b0.ptr = (PromiseNode *)0x0;
  local_a0.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<int,int,kj::(anonymous_namespace)::TestCase679::run()::$_1,kj::_::PropagateException>>
        ::instance;
  local_80.ptr = (AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::DestructorDetector>_> *)
                 0x0;
  local_a0.ptr = (PromiseNode *)pTVar2;
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_80);
  Own<kj::_::PromiseNode>::dispose(&local_b0);
  Own<kj::_::PromiseNode>::operator=((Own<kj::_::PromiseNode> *)&promise,&local_a0);
  Own<kj::_::PromiseNode>::dispose(&local_a0);
  if ((destroyed == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[30]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x2b7,ERROR,"\"failed: expected \" \"!(destroyed)\"",
               (char (*) [30])"failed: expected !(destroyed)");
  }
  _Var1 = Promise<int>::wait(&promise,&waitScope);
  if (_Var1 != 0x1bc && _::Debug::minSeverity < 3) {
    local_b0.disposer = (Disposer *)CONCAT44(local_b0.disposer._4_4_,0x1bc);
    _Var1 = Promise<int>::wait(&promise,&waitScope);
    local_80.disposer = (Disposer *)CONCAT44(local_80.disposer._4_4_,_Var1);
    _::Debug::log<char_const(&)[52],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x2b8,ERROR,
               "\"failed: expected \" \"(444) == (promise.wait(waitScope))\", 444, promise.wait(waitScope)"
               ,(char (*) [52])"failed: expected (444) == (promise.wait(waitScope))",
               (int *)&local_b0,(int *)&local_80);
  }
  if ((destroyed == false) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[27]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x2b9,ERROR,"\"failed: expected \" \"destroyed\"",
               (char (*) [27])"failed: expected destroyed");
  }
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&promise);
  WaitScope::~WaitScope(&waitScope);
  EventLoop::~EventLoop(&loop);
  return;
}

Assistant:

TEST(Async, Attach) {
  bool destroyed = false;

  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<int> promise = evalLater([&]() {
    EXPECT_FALSE(destroyed);
    return 123;
  }).attach(kj::heap<DestructorDetector>(destroyed));

  promise = promise.then([&](int i) {
    EXPECT_TRUE(destroyed);
    return i + 321;
  });

  EXPECT_FALSE(destroyed);
  EXPECT_EQ(444, promise.wait(waitScope));
  EXPECT_TRUE(destroyed);
}